

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_lee_2021_bmrs_no_zeroinit.h
# Opt level: O1

void __thiscall
BMRS_XZ<UFPC>::PerformLabelingMem
          (BMRS_XZ<UFPC> *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *accesses)

{
  int *piVar1;
  ushort uVar2;
  ushort uVar3;
  uint uVar4;
  Mat1b *pMVar5;
  pointer puVar6;
  pointer puVar7;
  pointer piVar8;
  Run *pRVar9;
  int height;
  int iVar10;
  uint uVar11;
  uint64_t *puVar12;
  Run *pRVar13;
  ulong uVar14;
  uint uVar15;
  uint64_t *puVar16;
  long lVar17;
  uint uVar18;
  uint64_t *puVar19;
  ulong uVar20;
  long lVar21;
  ulong uVar22;
  uint64_t *puVar23;
  uint64_t *puVar24;
  long lVar25;
  long lVar26;
  ulong uVar27;
  long lVar28;
  int iVar29;
  long lVar30;
  int iVar31;
  int iVar32;
  uint uVar33;
  double dVar34;
  MemMat<int> img_labels;
  MemMat<unsigned_char> img;
  long local_348;
  long local_310;
  Size local_2a0;
  undefined1 local_298 [8];
  void *pvStack_290;
  Size local_288;
  undefined4 local_238;
  Mat *local_230;
  undefined8 local_228;
  undefined1 local_220 [104];
  Mat local_1b8 [16];
  long local_1a8;
  long *local_170;
  undefined1 local_158 [104];
  Mat local_f0 [16];
  long local_e0;
  long *local_a8;
  Mat local_90 [96];
  
  cv::Mat::Mat(local_90,&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->super_Mat);
  MemMat<unsigned_char>::MemMat((MemMat<unsigned_char> *)local_158,(Mat_<unsigned_char> *)local_90);
  cv::Mat::~Mat(local_90);
  uVar20 = **(ulong **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x40;
  local_2a0 = (Size)(uVar20 << 0x20 | uVar20 >> 0x20);
  MemMat<int>::MemMat((MemMat<int> *)local_220,&local_2a0,0);
  pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  uVar4 = *(uint *)&pMVar5->field_0xc;
  uVar20 = (ulong)(int)uVar4;
  uVar18 = *(uint *)&pMVar5->field_0x8;
  (this->data_compressed).height = uVar18;
  uVar33 = uVar4 + 0x3f;
  if (-1 < (long)uVar20) {
    uVar33 = uVar4;
  }
  (this->data_compressed).width = uVar4;
  iVar31 = (int)uVar33 >> 6;
  iVar32 = iVar31 + 1;
  (this->data_compressed).data_width = iVar32;
  uVar22 = (long)(int)(iVar32 * uVar18) * 8;
  if ((int)(iVar32 * uVar18) < 0) {
    uVar22 = 0xffffffffffffffff;
  }
  puVar12 = (uint64_t *)operator_new__(uVar22);
  (this->data_compressed).bits = puVar12;
  InitCompressedDataMem(this,&this->data_compressed,(MemMat<unsigned_char> *)local_158);
  uVar15 = (int)uVar18 / 2;
  iVar29 = (int)uVar18 % 2;
  height = uVar15 + iVar29;
  uVar33 = (this->data_compressed).data_width;
  uVar14 = (ulong)uVar33;
  (this->data_merged).height = height;
  (this->data_merged).width = uVar4;
  (this->data_merged).data_width = iVar32;
  uVar22 = (long)(height * iVar32) * 8;
  if (height * iVar32 < 0) {
    uVar22 = 0xffffffffffffffff;
  }
  puVar12 = (uint64_t *)operator_new__(uVar22);
  (this->data_merged).bits = puVar12;
  if (1 < (int)uVar18) {
    puVar16 = (this->data_compressed).bits;
    lVar17 = (long)(this->data_compressed).data_width;
    puVar23 = puVar16 + lVar17;
    uVar22 = 0;
    puVar24 = puVar12;
    do {
      if (0 < (int)uVar33) {
        uVar27 = 0;
        do {
          puVar24[uVar27] = puVar23[uVar27] | puVar16[uVar27];
          uVar27 = uVar27 + 1;
        } while (uVar14 != uVar27);
      }
      uVar22 = uVar22 + 1;
      puVar24 = puVar24 + (long)iVar31 + 1;
      puVar23 = puVar23 + lVar17 * 2;
      puVar16 = puVar16 + lVar17 * 2;
    } while (uVar22 != uVar15);
  }
  if ((iVar29 != 0) && (0 < (int)uVar33)) {
    iVar10 = (this->data_compressed).data_width;
    puVar23 = (this->data_compressed).bits;
    uVar22 = 0;
    do {
      puVar12[(long)(int)uVar15 * (long)iVar32 + uVar22] =
           puVar23[(long)iVar10 * (long)(int)(uVar18 - 1) + uVar22];
      uVar22 = uVar22 + 1;
    } while (uVar14 != uVar22);
  }
  (this->data_flags).height = height + -1;
  (this->data_flags).width = uVar4;
  (this->data_flags).data_width = iVar32;
  iVar10 = (height + -1) * iVar32;
  uVar22 = 0xffffffffffffffff;
  if (-1 < iVar10) {
    uVar22 = (long)iVar10 * 8;
  }
  puVar12 = (uint64_t *)operator_new__(uVar22);
  (this->data_flags).bits = puVar12;
  lVar17 = (long)(this->data_flags).height;
  if (0 < lVar17) {
    puVar16 = (this->data_compressed).bits;
    lVar21 = (long)(this->data_compressed).data_width;
    puVar23 = puVar16 + lVar21;
    lVar30 = 0;
    puVar19 = puVar12;
    puVar24 = puVar16;
    do {
      puVar24 = puVar24 + lVar21 * 2;
      puVar12[lVar30 * iVar32] =
           (puVar16[(lVar30 * 2 + 2) * lVar21] * 2 | puVar16[(lVar30 * 2 + 2) * lVar21]) &
           (puVar16[(lVar30 * 2 + 1) * lVar21] * 2 | puVar16[(lVar30 * 2 + 1) * lVar21]);
      if (1 < (int)uVar33) {
        uVar22 = 1;
        do {
          puVar19[uVar22] =
               (puVar24[uVar22 - 1] >> 0x3f | puVar24[uVar22] << 1 | puVar24[uVar22]) &
               (puVar23[uVar22 - 1] >> 0x3f | puVar23[uVar22] << 1 | puVar23[uVar22]);
          uVar22 = uVar22 + 1;
        } while (uVar14 != uVar22);
      }
      lVar30 = lVar30 + 1;
      puVar19 = puVar19 + (long)iVar31 + 1;
      puVar23 = puVar23 + lVar21 * 2;
    } while (lVar30 != lVar17);
  }
  (this->data_runs).height = uVar18;
  (this->data_runs).width = uVar4;
  pRVar13 = (Run *)operator_new__((ulong)((((uint)(uVar20 >> 1) & 0x7fffffff) + 2) * uVar18 + 1) <<
                                  3);
  (this->data_runs).runs = pRVar13;
  pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  iVar32 = *(int *)&pMVar5->field_0x8;
  iVar31 = *(int *)&pMVar5->field_0xc;
  UFPC::MemAlloc(((iVar31 - (iVar31 + 1 >> 0x1f)) + 1 >> 1) *
                 ((iVar32 - (iVar32 + 1 >> 0x1f)) + 1 >> 1) + 1);
  *UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
   super__Vector_impl_data._M_start =
       *UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start + 1;
  *UFPC::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
   super__Vector_impl_data._M_start = 0;
  UFPC::length_ = 1;
  FindRunsMem(this,(this->data_merged).bits,(this->data_flags).bits,height,uVar33,
              (this->data_runs).runs);
  pRVar13 = (this->data_runs).runs;
  if (1 < (int)uVar18) {
    local_348 = 1;
    local_310 = 0;
    uVar22 = 0;
    do {
      piVar8 = UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar7 = UFPC::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      iVar32 = 0;
      pRVar9 = pRVar13;
      do {
        pRVar13 = pRVar9;
        uVar2 = pRVar13->start_pos;
        if (uVar2 == 0xffff) {
          if (iVar32 < (int)uVar4) {
            uVar14 = (ulong)iVar32;
            lVar17 = *local_170;
            lVar21 = *(long *)local_220._80_8_;
            do {
              piVar1 = (int *)(lVar17 * local_310 + local_1a8 + uVar14 * 4);
              *piVar1 = *piVar1 + 1;
              *(undefined4 *)(lVar21 * local_310 + local_220._24_8_ + uVar14 * 4) = 0;
              uVar14 = uVar14 + 1;
            } while (uVar20 != uVar14);
          }
          if (iVar32 < (int)uVar4) {
            uVar14 = (ulong)iVar32;
            lVar17 = *local_170;
            lVar21 = *(long *)local_220._80_8_;
            do {
              piVar1 = (int *)(lVar17 * local_348 + local_1a8 + uVar14 * 4);
              *piVar1 = *piVar1 + 1;
              *(undefined4 *)(lVar21 * local_348 + local_220._24_8_ + uVar14 * 4) = 0;
              uVar14 = uVar14 + 1;
            } while (uVar20 != uVar14);
          }
          pRVar13 = pRVar13 + 1;
        }
        else {
          uVar3 = pRVar13->end_pos;
          uVar33 = pRVar13->label;
          piVar8[(int)uVar33] = piVar8[(int)uVar33] + 1;
          uVar33 = puVar7[(int)uVar33];
          if (iVar32 < (int)(uint)uVar2) {
            lVar17 = *local_170;
            lVar21 = *(long *)local_220._80_8_;
            lVar30 = (long)iVar32;
            lVar28 = 0;
            do {
              piVar1 = (int *)(local_310 * lVar17 + lVar30 * 4 + local_1a8 + lVar28 * 4);
              *piVar1 = *piVar1 + 1;
              *(undefined4 *)(local_310 * lVar21 + lVar30 * 4 + local_220._24_8_ + lVar28 * 4) = 0;
              piVar1 = (int *)(lVar17 * local_348 + lVar30 * 4 + local_1a8 + lVar28 * 4);
              *piVar1 = *piVar1 + 1;
              *(undefined4 *)(lVar21 * local_348 + lVar30 * 4 + local_220._24_8_ + lVar28 * 4) = 0;
              lVar28 = lVar28 + 1;
            } while ((ulong)uVar2 - lVar30 != lVar28);
            iVar32 = iVar32 + (int)lVar28;
          }
          if (iVar32 < (int)(uint)uVar3) {
            lVar17 = *local_a8;
            lVar21 = *(long *)local_158._80_8_;
            lVar30 = *local_170;
            lVar28 = *(long *)local_220._80_8_;
            lVar25 = (long)iVar32;
            lVar26 = 0;
            do {
              piVar1 = (int *)(local_310 * lVar17 + lVar25 * 4 + local_e0 + lVar26 * 4);
              *piVar1 = *piVar1 + 1;
              uVar11 = uVar33;
              if (*(char *)(local_310 * lVar21 + local_158._24_8_ + lVar25 + lVar26) == '\0') {
                uVar11 = 0;
              }
              piVar1 = (int *)(local_310 * lVar30 + lVar25 * 4 + local_1a8 + lVar26 * 4);
              *piVar1 = *piVar1 + 1;
              *(uint *)(local_310 * lVar28 + lVar25 * 4 + local_220._24_8_ + lVar26 * 4) = uVar11;
              piVar1 = (int *)(lVar17 * local_348 + lVar25 * 4 + local_e0 + lVar26 * 4);
              *piVar1 = *piVar1 + 1;
              uVar11 = uVar33;
              if (*(char *)(lVar21 * local_348 + local_158._24_8_ + lVar25 + lVar26) == '\0') {
                uVar11 = 0;
              }
              piVar1 = (int *)(lVar30 * local_348 + lVar25 * 4 + local_1a8 + lVar26 * 4);
              *piVar1 = *piVar1 + 1;
              *(uint *)(lVar28 * local_348 + lVar25 * 4 + local_220._24_8_ + lVar26 * 4) = uVar11;
              lVar26 = lVar26 + 1;
            } while ((ulong)uVar3 - lVar25 != lVar26);
            iVar32 = iVar32 + (int)lVar26;
          }
        }
        pRVar9 = pRVar13 + 1;
      } while (uVar2 != 0xffff);
      uVar22 = uVar22 + 1;
      local_310 = local_310 + 2;
      local_348 = local_348 + 2;
    } while (uVar22 != uVar15);
  }
  piVar8 = UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar7 = UFPC::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
           .super__Vector_impl_data._M_start;
  if (iVar29 != 0) {
    lVar17 = (long)(int)uVar18 + -1;
    lVar21 = (long)(int)lVar17;
    uVar20 = 0;
    do {
      uVar2 = pRVar13->start_pos;
      uVar22 = (ulong)uVar2;
      uVar18 = (uint)uVar2;
      uVar33 = (uint)uVar20;
      if (uVar2 == 0xffff) {
        if ((int)uVar33 < (int)uVar4) {
          lVar30 = *local_170;
          lVar28 = *(long *)local_220._80_8_;
          uVar15 = uVar4;
          do {
            piVar1 = (int *)(lVar30 * lVar21 + local_1a8 + (long)(int)uVar33 * 4);
            *piVar1 = *piVar1 + 1;
            *(undefined4 *)(lVar28 * lVar21 + local_220._24_8_ + (long)(int)uVar33 * 4) = 0;
            uVar15 = uVar15 - 1;
          } while (uVar33 != uVar15);
        }
      }
      else {
        uVar3 = pRVar13->end_pos;
        uVar15 = pRVar13->label;
        piVar8[(int)uVar15] = piVar8[(int)uVar15] + 1;
        uVar15 = puVar7[(int)uVar15];
        if ((int)uVar33 < (int)uVar18) {
          lVar30 = *local_170;
          lVar28 = *(long *)local_220._80_8_;
          uVar20 = (ulong)(int)uVar33;
          do {
            piVar1 = (int *)(lVar30 * lVar17 + local_1a8 + uVar20 * 4);
            *piVar1 = *piVar1 + 1;
            *(undefined4 *)(lVar28 * lVar17 + local_220._24_8_ + uVar20 * 4) = 0;
            uVar20 = uVar20 + 1;
          } while (uVar18 != uVar20);
        }
        uVar20 = (ulong)uVar18;
        if (uVar2 < uVar3) {
          lVar30 = *local_170;
          lVar28 = *(long *)local_220._80_8_;
          do {
            piVar1 = (int *)(lVar30 * lVar21 + local_1a8 + uVar22 * 4);
            *piVar1 = *piVar1 + 1;
            *(uint *)(lVar28 * lVar21 + local_220._24_8_ + uVar22 * 4) = uVar15;
            uVar22 = uVar22 + 1;
            uVar20 = uVar22;
          } while (uVar3 != uVar22);
        }
      }
      pRVar13 = pRVar13 + 1;
    } while (uVar18 != 0xffff);
  }
  local_298 = (undefined1  [8])0x0;
  pvStack_290 = (void *)0x0;
  local_288.width = 0;
  local_288.height = 0;
  local_298 = (undefined1  [8])operator_new(0x20);
  pvStack_290 = (void *)((long)local_298 + 0x20);
  *(undefined8 *)((long)local_298 + 0x10) = 0;
  *(undefined8 *)((long)local_298 + 0x18) = 0;
  *(undefined8 *)local_298 = 0;
  *(undefined8 *)((long)local_298 + 8) = 0;
  local_288 = (Size)pvStack_290;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign(accesses,local_298);
  if (local_298 != (undefined1  [8])0x0) {
    operator_delete((void *)local_298,(long)local_288 - (long)local_298);
  }
  local_228 = 0;
  local_238 = 0x81010004;
  local_230 = local_f0;
  cv::sum((_InputArray *)local_298);
  *(accesses->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
   super__Vector_impl_data._M_start =
       (long)((double)local_298 - 9.223372036854776e+18) & (long)(double)local_298 >> 0x3f |
       (long)(double)local_298;
  local_228 = 0;
  local_238 = 0x81010004;
  local_230 = local_1b8;
  cv::sum((_InputArray *)local_298);
  puVar6 = (accesses->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar6[1] = (long)((double)local_298 - 9.223372036854776e+18) & (long)(double)local_298 >> 0x3f |
              (long)(double)local_298;
  if ((long)UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start == 0) {
    uVar20 = 0;
  }
  else {
    lVar17 = (long)UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2;
    dVar34 = 0.0;
    lVar21 = 0;
    do {
      dVar34 = dVar34 + (double)UFPC::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>
                                ._M_impl.super__Vector_impl_data._M_start[lVar21];
      lVar21 = lVar21 + 1;
    } while (lVar17 + (ulong)(lVar17 == 0) != lVar21);
    uVar20 = (long)(dVar34 - 9.223372036854776e+18) & (long)dVar34 >> 0x3f | (long)dVar34;
  }
  puVar6[2] = uVar20;
  MemMat<int>::GetImage((Mat_<int> *)local_298,(MemMat<int> *)local_220);
  cv::Mat::operator=(&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat,
                     (Mat *)local_298);
  cv::Mat::~Mat((Mat *)local_298);
  pRVar13 = (this->data_runs).runs;
  if (pRVar13 != (Run *)0x0) {
    operator_delete__(pRVar13);
  }
  puVar12 = (this->data_flags).bits;
  if (puVar12 != (uint64_t *)0x0) {
    operator_delete__(puVar12);
  }
  puVar12 = (this->data_merged).bits;
  if (puVar12 != (uint64_t *)0x0) {
    operator_delete__(puVar12);
  }
  puVar12 = (this->data_compressed).bits;
  if (puVar12 != (uint64_t *)0x0) {
    operator_delete__(puVar12);
  }
  cv::Mat::~Mat(local_1b8);
  cv::Mat::~Mat((Mat *)(local_220 + 8));
  cv::Mat::~Mat(local_f0);
  cv::Mat::~Mat((Mat *)(local_158 + 8));
  return;
}

Assistant:

void PerformLabelingMem(std::vector<uint64_t>& accesses) {
        //Data structure for memory test
        MemMat<unsigned char> img(img_);
        MemMat<int> img_labels(img_.size(), 0);

        int w(img_.cols);
        int h(img_.rows);

        data_compressed.Alloc(h, w);
        InitCompressedDataMem(data_compressed, img);

        //generate merged data
        int h_merge = h / 2 + h % 2;
        int data_width = data_compressed.data_width;
        data_merged.Alloc(h_merge, w);
        for (int i = 0; i < h / 2; i++) {
            uint64_t* pdata_source1 = data_compressed[2 * i];
            uint64_t* pdata_source2 = data_compressed[2 * i + 1];
            uint64_t* pdata_merged = data_merged[i];
            for (int j = 0; j < data_width; j++) pdata_merged[j] = pdata_source1[j] | pdata_source2[j];
        }
        if (h % 2) {
            uint64_t* pdata_source = data_compressed[h - 1];
            uint64_t* pdata_merged = data_merged[h / 2];
            for (int j = 0; j < data_width; j++) pdata_merged[j] = pdata_source[j];
        }

        //generate flag bits
        data_flags.Alloc(h_merge - 1, w);
        for (int i = 0; i < data_flags.height; i++) {
            uint64_t* bits_u = data_compressed[2 * i + 1];
            uint64_t* bits_d = data_compressed[2 * i + 2];
            uint64_t* bits_dest = data_flags[i];

            uint64_t u0 = bits_u[0];
            uint64_t d0 = bits_d[0];
            bits_dest[0] = (u0 | (u0 << 1)) & (d0 | (d0 << 1));
            for (int j = 1; j < data_width; j++) {
                uint64_t u = bits_u[j];
                uint64_t u_shl = u << 1;
                uint64_t d = bits_d[j];
                uint64_t d_shl = d << 1;
                if (bits_u[j - 1] & 0x8000000000000000) u_shl |= 1;
                if (bits_d[j - 1] & 0x8000000000000000) d_shl |= 1;
                bits_dest[j] = (u | u_shl) & (d | d_shl);
            }
        }

        //find runs
        data_runs.Alloc(h, w);
        LabelsSolver::MemAlloc(UPPER_BOUND_8_CONNECTIVITY);
        LabelsSolver::MemSetup();
        FindRunsMem(data_merged.bits, data_flags.bits, h_merge, data_width, data_runs.runs);

        Run* runs = data_runs.runs;
        for (int i = 0; i < h / 2; i++) {
            int i_u = 2 * i;
            int i_d = i_u + 1;

            for (int j = 0;; runs++) {
                unsigned short start_pos = runs->start_pos;
                if (start_pos == 0xFFFF) {
                    for (int k = j; k < w; k++) img_labels(i_u, k) = 0;
                    for (int k = j; k < w; k++) img_labels(i_d, k) = 0;
                    runs++;
                    break;
                }
                unsigned short end_pos = runs->end_pos;
                int label = LabelsSolver::MemGetLabel(runs->label);

                for (; j < start_pos; j++) img_labels(i_u, j) = 0, img_labels(i_d, j) = 0;
                for (; j < end_pos; j++) {
                    img_labels(i_u, j) = img(i_u, j) ? label : 0;
                    img_labels(i_d, j) = img(i_d, j) ? label : 0;
                }
            }
        }
        if (h % 2) {
            int i = h - 1;
            for (int j = 0;; runs++) {
                unsigned short start_pos = runs->start_pos;
                if (start_pos == 0xFFFF) {
                    for (int k = j; k < w; k++) img_labels(i, j) = 0;
                    break;
                }
                unsigned short end_pos = runs->end_pos;
                int label = LabelsSolver::MemGetLabel(runs->label);
                for (; j < start_pos; j++) img_labels(i, j) = 0;
                for (j = start_pos; j < end_pos; j++) img_labels(i, j) = label;
            }
        }

        // Store total accesses in the output vector 'accesses'
        accesses = std::vector<uint64_t>((int)MD_SIZE, 0);

        accesses[MD_BINARY_MAT] = (uint64_t)img.GetTotalAccesses();
        accesses[MD_LABELED_MAT] = (uint64_t)img_labels.GetTotalAccesses();
        accesses[MD_EQUIVALENCE_VEC] = (uint64_t)LabelsSolver::MemTotalAccesses();

        img_labels_ = img_labels.GetImage();

        LabelsSolver::MemDealloc();
        data_runs.Dealloc();
        data_flags.Dealloc();
        data_merged.Dealloc();
        data_compressed.Dealloc();
    }